

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void GrcManager::DebugHex(ostream *strmOut,gid16 wGlyphID)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  code cVar5;
  code cVar6;
  
  pp_Var2 = strmOut->_vptr_basic_ostream;
  p_Var3 = pp_Var2[-3];
  uVar1 = *(undefined4 *)(&strmOut->field_0x18 + (long)p_Var3);
  *(undefined4 *)(&strmOut->field_0x18 + (long)p_Var3) = 8;
  p_Var4 = pp_Var2[-3];
  p_Var3 = (_func_int *)((long)&strmOut->_vptr_basic_ostream + (long)p_Var4);
  if ((&strmOut->field_0xe1)[(long)p_Var4] == '\0') {
    cVar5 = (code)std::ios::widen((char)p_Var3);
    p_Var3[0xe0] = cVar5;
    p_Var3[0xe1] = (code)0x1;
  }
  cVar5 = p_Var3[0xe0];
  pp_Var2 = strmOut->_vptr_basic_ostream;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&strmOut->field_0x18 + (long)p_Var3) =
       *(uint *)(&strmOut->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  *(uint *)(&strmOut->field_0x18 + (long)pp_Var2[-3]) =
       *(uint *)(&strmOut->field_0x18 + (long)pp_Var2[-3]) & 0xfffffdff;
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"0x",2);
  p_Var3 = (_func_int *)
           ((long)&strmOut->_vptr_basic_ostream + (long)strmOut->_vptr_basic_ostream[-3]);
  if ((&strmOut->field_0xe1)[(long)strmOut->_vptr_basic_ostream[-3]] == '\0') {
    cVar6 = (code)std::ios::widen((char)p_Var3);
    p_Var3[0xe0] = cVar6;
    p_Var3[0xe1] = (code)0x1;
  }
  p_Var3[0xe0] = (code)0x30;
  *(undefined8 *)(&strmOut->field_0x10 + (long)strmOut->_vptr_basic_ostream[-3]) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)strmOut);
  pp_Var2 = strmOut->_vptr_basic_ostream;
  *(undefined4 *)(&strmOut->field_0x18 + (long)pp_Var2[-3]) = uVar1;
  p_Var4 = pp_Var2[-3];
  p_Var3 = (_func_int *)((long)&strmOut->_vptr_basic_ostream + (long)p_Var4);
  if ((&strmOut->field_0xe1)[(long)p_Var4] == '\0') {
    cVar6 = (code)std::ios::widen((char)p_Var3);
    p_Var3[0xe0] = cVar6;
    p_Var3[0xe1] = (code)0x1;
  }
  p_Var3[0xe0] = cVar5;
  return;
}

Assistant:

void GrcManager::DebugHex(std::ostream & strmOut, gid16 wGlyphID)
{
	auto const flags = strmOut.flags(std::ios::hex); auto const fill = strmOut.fill();
	strmOut << std::hex << std::noshowbase
			<< "0x"  << std::setfill('0') << std::setw(4) << wGlyphID;
	strmOut.flags(flags); strmOut.fill(fill);
}